

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O1

int mbedtls_rsa_check_privkey(mbedtls_rsa_context *ctx)

{
  int iVar1;
  int blinding_needed;
  int iVar2;
  
  iVar1 = mbedtls_rsa_check_pubkey(ctx);
  iVar2 = -0x4200;
  if (iVar1 == 0) {
    iVar1 = rsa_check_context(ctx,1,blinding_needed);
    if (iVar1 == 0) {
      iVar1 = mbedtls_rsa_validate_params
                        (&ctx->N,&ctx->P,&ctx->Q,&ctx->D,&ctx->E,
                         (_func_int_void_ptr_uchar_ptr_size_t *)0x0,(void *)0x0);
      if (iVar1 == 0) {
        iVar1 = mbedtls_rsa_validate_crt(&ctx->P,&ctx->Q,&ctx->D,&ctx->DP,&ctx->DQ,&ctx->QP);
        iVar2 = -0x4200;
        if (iVar1 == 0) {
          iVar2 = 0;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_rsa_check_privkey( const mbedtls_rsa_context *ctx )
{
    if( mbedtls_rsa_check_pubkey( ctx ) != 0 ||
        rsa_check_context( ctx, 1 /* private */, 1 /* blinding */ ) != 0 )
    {
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );
    }

    if( mbedtls_rsa_validate_params( &ctx->N, &ctx->P, &ctx->Q,
                                     &ctx->D, &ctx->E, NULL, NULL ) != 0 )
    {
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );
    }

#if !defined(MBEDTLS_RSA_NO_CRT)
    else if( mbedtls_rsa_validate_crt( &ctx->P, &ctx->Q, &ctx->D,
                                       &ctx->DP, &ctx->DQ, &ctx->QP ) != 0 )
    {
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );
    }
#endif

    return( 0 );
}